

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O3

void cvui::internal::window
               (cvui_block_t *theBlock,int theX,int theY,int theWidth,int theHeight,String *theTitle
               )

{
  Rect aContent;
  Rect aTitleBar;
  Size local_40;
  Rect local_38;
  Rect local_28;
  
  local_28.height = 0x14;
  local_38.y = theY + 0x14;
  local_38.height = theHeight + -0x14;
  local_38.x = theX;
  local_38.width = theWidth;
  local_28.x = theX;
  local_28.y = theY;
  local_28.width = theWidth;
  render::window(theBlock,&local_28,&local_38,theTitle);
  local_40.width = theWidth;
  local_40.height = theHeight;
  updateLayoutFlow(theBlock,&local_40);
  return;
}

Assistant:

void window(cvui_block_t& theBlock, int theX, int theY, int theWidth, int theHeight, const cv::String& theTitle) {
		cv::Rect aTitleBar(theX, theY, theWidth, 20);
		cv::Rect aContent(theX, theY + aTitleBar.height, theWidth, theHeight - aTitleBar.height);

		render::window(theBlock, aTitleBar, aContent, theTitle);

		// Update the layout flow
		cv::Size aSize(theWidth, theHeight);
		updateLayoutFlow(theBlock, aSize);
	}